

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

QString * __thiscall
QFileSystemModelPrivate::size
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  quintptr qVar1;
  Type TVar2;
  qint64 bytes;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) || ((index->m).ptr == (QAbstractItemModel *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_006125a2;
  }
  qVar1 = index->i;
  if (*(QExtendedInformation **)(qVar1 + 0x38) == (QExtendedInformation *)0x0) {
    if ((*(long *)(qVar1 + 0x18) == 0) || (*(long *)(*(long *)(qVar1 + 0x18) + 8) < 1)) {
LAB_0061257d:
      bytes = 0;
      goto LAB_0061257f;
    }
  }
  else {
    TVar2 = QExtendedInformation::type(*(QExtendedInformation **)(qVar1 + 0x38));
    if (TVar2 != Dir) {
      if ((*(QExtendedInformation **)(qVar1 + 0x38) == (QExtendedInformation *)0x0) ||
         (TVar2 = QExtendedInformation::type(*(QExtendedInformation **)(qVar1 + 0x38)), TVar2 == Dir
         )) goto LAB_0061257d;
      bytes = QExtendedInformation::size(*(QExtendedInformation **)(qVar1 + 0x38));
LAB_0061257f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        size(__return_storage_ptr__,bytes);
        return __return_storage_ptr__;
      }
      goto LAB_006125a2;
    }
  }
  QVar3.m_data = (storage_type *)0x0;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromLatin1(QVar3);
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = pcStack_30;
  (__return_storage_ptr__->d).size = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_006125a2:
  __stack_chk_fail();
}

Assistant:

QString QFileSystemModelPrivate::size(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    const QFileSystemNode *n = node(index);
    if (n->isDir()) {
#ifdef Q_OS_MAC
        return "--"_L1;
#else
        return ""_L1;
#endif
    // Windows   - ""
    // OS X      - "--"
    // Konqueror - "4 KB"
    // Nautilus  - "9 items" (the number of children)
    }
    return size(n->size());
}